

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setMaximumFractionDigits(DecimalFormat *this,int32_t newValue)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->maximumFractionDigits != newValue) {
    if (newValue < pDVar1->minimumFractionDigits && -1 < pDVar1->minimumFractionDigits) {
      pDVar1->minimumFractionDigits = newValue;
    }
    pDVar1->maximumFractionDigits = newValue;
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setMaximumFractionDigits(int32_t newValue) {
    if (newValue == fields->properties->maximumFractionDigits) { return; }
    // For backwards compatibility, conflicting min/max need to keep the most recent setting.
    int32_t min = fields->properties->minimumFractionDigits;
    if (min >= 0 && min > newValue) {
        fields->properties->minimumFractionDigits = newValue;
    }
    fields->properties->maximumFractionDigits = newValue;
    touchNoError();
}